

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiDockNode * ImGui::DockNodeTreeFindFallbackLeafNode(ImGuiDockNode *node)

{
  ImGuiDockNode *pIVar1;
  ImGuiDockNode *node_00;
  
  node_00 = node->ChildNodes[0];
  while ((pIVar1 = node, node_00 != (ImGuiDockNode *)0x0 &&
         (pIVar1 = DockNodeTreeFindFallbackLeafNode(node_00), pIVar1 == (ImGuiDockNode *)0x0))) {
    node = node->ChildNodes[1];
    node_00 = node->ChildNodes[0];
  }
  return pIVar1;
}

Assistant:

ImGuiDockNode* ImGui::DockNodeTreeFindFallbackLeafNode(ImGuiDockNode* node)
{
    if (node->IsLeafNode())
        return node;
    if (ImGuiDockNode* leaf_node = DockNodeTreeFindFallbackLeafNode(node->ChildNodes[0]))
        return leaf_node;
    if (ImGuiDockNode* leaf_node = DockNodeTreeFindFallbackLeafNode(node->ChildNodes[1]))
        return leaf_node;
    return NULL;
}